

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_noncentral_relative_pose_sac.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  double dVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  timeval tVar11;
  timeval tVar12;
  double in_stack_00000020;
  double in_stack_000000c0;
  double in_stack_000000c8;
  rotations_t *in_stack_000000d0;
  translations_t *in_stack_000000d8;
  rotation_t *in_stack_000000e0;
  translation_t *in_stack_000000e8;
  rotation_t *in_stack_000000f0;
  translation_t *in_stack_000000f8;
  size_t in_stack_00000108;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_00000110;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_00000118;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_00000120;
  size_t j;
  size_t i_1;
  size_t i;
  size_t numberInliers;
  double ransac_time;
  timeval toc;
  timeval tic;
  shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
  relposeproblem_ptr;
  MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem> ransac;
  NoncentralRelativeMultiAdapter adapter;
  rotation_t rotation;
  translation_t position;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  gt;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors2;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors1;
  rotations_t camRotations;
  translations_t camOffsets;
  rotation_t rotation2;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  int numberCameras;
  size_t pointsPerCam;
  double outlierFraction;
  double noise;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffa60;
  ulong uVar13;
  MultiNoncentralRelativePoseSacProblem *__p;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_fffffffffffffa68;
  NoncentralRelativeMultiAdapter *this;
  rotation_t *rotation_00;
  int maxIterations;
  MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem> *this_00;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_fffffffffffffab0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_fffffffffffffab8;
  double in_stack_fffffffffffffac0;
  rotations_t *in_stack_fffffffffffffac8;
  adapter_t *in_stack_fffffffffffffad0;
  MultiNoncentralRelativePoseSacProblem *in_stack_fffffffffffffad8;
  rotations_t *in_stack_fffffffffffffae8;
  rotation_t *in_stack_fffffffffffffaf0;
  translation_t *in_stack_fffffffffffffaf8;
  rotation_t *in_stack_fffffffffffffb00;
  NoncentralRelativeMultiAdapter *in_stack_fffffffffffffb08;
  translation_t *in_stack_fffffffffffffb10;
  translation_t *in_stack_fffffffffffffb18;
  ulong local_478;
  ulong local_470;
  size_type local_468;
  ulong local_460;
  int in_stack_fffffffffffffbd4;
  MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
  *in_stack_fffffffffffffbd8;
  timeval local_420 [2];
  undefined4 local_3f8;
  int local_3f4;
  double local_3f0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_368;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_fffffffffffffcb0;
  ostream *in_stack_fffffffffffffcb8;
  undefined1 local_1c0 [48];
  NoncentralRelativeMultiAdapter local_190;
  undefined4 local_5c;
  ulong local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_34;
  
  local_34 = 0;
  opengv::initializeRandomSeed();
  local_48 = 0x3fd3333333333333;
  local_50 = 0x3fb999999999999a;
  local_58 = 0x19;
  local_5c = 4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa68,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffa60);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  opengv::generateRandomTranslation(in_stack_fffffffffffffac0);
  opengv::generateRandomRotation(in_stack_00000020);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xbe1f64);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xbe1f71);
  opengv::generateRandomCameraSystem
            ((int)((ulong)in_stack_fffffffffffffad8 >> 0x20),
             (translations_t *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  this = &local_190;
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
            *)0xbe1fa6);
  rotation_00 = (rotation_t *)(local_1c0 + 0x18);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
            *)0xbe1fbb);
  this_00 = (MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
             *)local_1c0;
  std::
  vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::vector((vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
            *)0xbe1fd0);
  uVar13 = local_58;
  opengv::generateMulti2D2DCorrespondences
            (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
             in_stack_000000d8,in_stack_000000d0,in_stack_00000108,in_stack_000000c8,
             in_stack_000000c0,in_stack_00000110,in_stack_00000118,in_stack_00000120);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xbe2058);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xbe2067);
  __p = (MultiNoncentralRelativePoseSacProblem *)(uVar13 & 0xffffffff00000000);
  opengv::extractRelativePose
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
             (rotation_t *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
  opengv::printExperimentCharacteristics
            ((translation_t *)this_00,rotation_00,(double)this,(double)__p);
  maxIterations = (int)((ulong)rotation_00 >> 0x20);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  opengv::relative_pose::NoncentralRelativeMultiAdapter::NoncentralRelativeMultiAdapter
            (in_stack_fffffffffffffb08,
             (vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
              *)in_stack_fffffffffffffb00,
             (vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
              *)in_stack_fffffffffffffaf8,(translations_t *)in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae8);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
             *)this_00);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
             *)this_00);
  opengv::sac::
  MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  MultiRansac(this_00,maxIterations,(double)this,(double)__p);
  operator_new(0x13f0);
  opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem::
  MultiNoncentralRelativePoseSacProblem
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
             (algorithm_t)((ulong)in_stack_fffffffffffffac8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffac8 >> 0x18,0),
             SUB81((ulong)in_stack_fffffffffffffac8 >> 0x10,0));
  std::shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem,void>
            ((shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
              *)this,__p);
  std::shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  operator=((shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
             *)this,(shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
                     *)__p);
  dVar7 = sqrt(2.0);
  dVar7 = atan((dVar7 * 0.5) / 800.0);
  dVar7 = cos(dVar7);
  local_3f0 = (1.0 - dVar7) + (1.0 - dVar7);
  uVar8 = 0;
  local_3f8 = 100;
  gettimeofday(local_420,(__timezone_ptr_t)0x0);
  opengv::sac::
  MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  computeModel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
  gettimeofday((timeval *)&stack0xfffffffffffffbd0,(__timezone_ptr_t)0x0);
  tVar11 = timeval_minus((timeval *)&stack0xfffffffffffffbd0,(timeval *)local_420);
  tVar12 = timeval_minus((timeval *)&stack0xfffffffffffffbd0,(timeval *)local_420);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (double)tVar11.tv_sec;
  auVar9._0_8_ = (double)tVar12.tv_usec;
  auVar9._8_8_ = uVar8;
  auVar9 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar9,auVar10);
  poVar1 = std::operator<<((ostream *)&std::cout,"the ransac threshold is: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_3f0);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the ransac results is: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ransac needed ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_3f4);
  std::operator<<(poVar1," iterations and ");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,auVar9._0_8_);
  poVar1 = std::operator<<(poVar1," seconds");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_460 = 0;
  local_468 = 0;
  while( true ) {
    sVar5 = local_468;
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&local_368);
    if (sVar3 <= sVar5) break;
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&local_368,local_468);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
    local_460 = sVar5 + local_460;
    local_468 = local_468 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"the number of inliers is: ");
  std::ostream::operator<<(poVar1,local_460);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the found inliers are: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_470 = 0;
  while( true ) {
    sVar5 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&local_368);
    if (sVar5 <= local_470) break;
    local_478 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&local_368,local_470);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      if (sVar5 <= local_478) break;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&local_368,local_470);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,local_478);
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar6);
      std::operator<<(poVar1," ");
      local_478 = local_478 + 1;
    }
    local_470 = local_470 + 1;
  }
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  ~shared_ptr((shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
               *)0xbe2837);
  opengv::sac::
  MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  ~MultiRansac((MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
                *)0xbe2844);
  opengv::relative_pose::NoncentralRelativeMultiAdapter::~NoncentralRelativeMultiAdapter(this);
  std::
  vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~vector((vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
             *)this_00);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
             *)this_00);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_00);
  return local_34;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.3;
  double outlierFraction = 0.1;
  size_t pointsPerCam = 25;
  int numberCameras = 4;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors1;
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors2;
  std::vector<std::shared_ptr<Eigen::MatrixXd> > gt;
  generateMulti2D2DCorrespondences(
      position1, rotation1, position2, rotation2, camOffsets, camRotations,
      pointsPerCam, noise, outlierFraction,
      multiBearingVectors1, multiBearingVectors2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation, false );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );
  
  //create a non-central relative multi-adapter
  relative_pose::NoncentralRelativeMultiAdapter adapter(
      multiBearingVectors1,
      multiBearingVectors2,
      camOffsets,
      camRotations);

  //Create a MultiNoncentralRelativePoseSacProblem and Ransac
  opengv::sac::MultiRansac<
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem> ransac;
  std::shared_ptr<
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem> relposeproblem_ptr(
      new sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem(
      adapter,
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem::SIXPT));
  ransac.sac_model_ = relposeproblem_ptr;
  ransac.threshold_ = 2.0*(1.0 - cos(atan(sqrt(2.0)*0.5/800.0)));
  ransac.max_iterations_ = 100;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //print the results
  std::cout << "the ransac threshold is: " << ransac.threshold_ << std::endl;
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_ << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  size_t numberInliers = 0;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    numberInliers += ransac.inliers_[i].size();
  std::cout << "the number of inliers is: " << numberInliers;
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
  {
    for(size_t j = 0; j < ransac.inliers_[i].size(); j++)
      std::cout << ransac.inliers_[i][j] << " ";
  }
  std::cout << std::endl << std::endl;
}